

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetExtensionFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *file,bool with_filename)

{
  char cVar1;
  string snake_name;
  string sStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  cVar1 = (char)file;
  anon_unknown_0::GetSnakeFilename(&sStack_148,(string *)(options->output_dir)._M_dataplus._M_p);
  StripProto(&local_48,&sStack_148);
  std::__cxx11::string::~string((string *)&sStack_148);
  std::operator+(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,"/");
  GetNamespace_abi_cxx11_(&local_c8,this,options,file);
  anon_unknown_0::ToLower(&local_a8,&local_c8);
  std::operator+(&local_68,&local_88,&local_a8);
  if (cVar1 == '\0') {
    std::__cxx11::string::string((string *)&local_108,"",(allocator *)&local_128);
  }
  else {
    std::operator+(&local_128,"_",&local_48);
    std::operator+(&local_108,&local_128,"_extensions");
  }
  std::operator+(&sStack_148,&local_68,&local_108);
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_e8,(GeneratorOptions *)this);
  std::operator+(__return_storage_ptr__,&sStack_148,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&sStack_148);
  std::__cxx11::string::~string((string *)&local_108);
  if (cVar1 != '\0') {
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GetExtensionFileName(const GeneratorOptions& options,
                                 const FileDescriptor* file,
                                 bool with_filename) {
  std::string snake_name = StripProto(GetSnakeFilename(file->name()));
  return options.output_dir + "/" + ToLower(GetNamespace(options, file)) +
         (with_filename ? ("_" + snake_name + "_extensions") : "") +
         options.GetFileNameExtension();
}